

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  size_type sVar4;
  undefined8 uVar5;
  Request *req_00;
  uint uVar6;
  char cVar7;
  bool bVar8;
  HandlerResponse HVar9;
  int iVar10;
  const_iterator cVar11;
  ssize_t sVar12;
  long lVar13;
  int extraout_var;
  int extraout_var_00;
  ulong uVar14;
  char cVar15;
  char *pcVar16;
  uint __len;
  size_t offset;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>_>
  pVar21;
  string __str;
  string s;
  string content_type;
  string boundary;
  string local_170;
  string local_150;
  undefined8 local_128;
  Server *local_120;
  Request *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  key_type local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_120 = this;
  if ((399 < res->status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    HVar9 = (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    need_apply_ranges = HVar9 == Handled || need_apply_ranges;
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  if (need_apply_ranges != false) {
    apply_ranges(local_120,req,res,&local_d0,&local_b0);
  }
  bVar19 = true;
  if (!close_connection) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Connection","");
    pVar21 = detail::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::equal_range(&(req->headers)._M_h,&local_70);
    if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
         )pVar21.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur ==
        pVar21.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       ) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)((long)&(((__node_type *)
                                   pVar21.first.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur)->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_storage._M_storage + 0x20);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,pcVar16,(allocator<char> *)&local_150);
    iVar10 = std::__cxx11::string::compare((char *)local_50);
    bVar19 = iVar10 == 0;
  }
  if (!close_connection) {
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  local_118 = req;
  if (bVar19) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Connection","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"close","");
    Response::set_header(res,&local_150,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
LAB_0016db2a:
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"timeout=","");
    uVar17 = local_120->keep_alive_timeout_sec_;
    uVar18 = -uVar17;
    if (0 < (long)uVar17) {
      uVar18 = uVar17;
    }
    __len = 1;
    if (9 < uVar18) {
      uVar14 = uVar18;
      uVar6 = 4;
      do {
        __len = uVar6;
        if (uVar14 < 100) {
          __len = __len - 2;
          goto LAB_0016e0aa;
        }
        if (uVar14 < 1000) {
          __len = __len - 1;
          goto LAB_0016e0aa;
        }
        if (uVar14 < 10000) goto LAB_0016e0aa;
        bVar19 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar6 = __len + 4;
      } while (bVar19);
      __len = __len + 1;
    }
LAB_0016e0aa:
    paVar1 = &local_170.field_2;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_170,(char)__len - (char)((long)uVar17 >> 0x3f))
    ;
    detail::std::__detail::__to_chars_10_impl<unsigned_long>
              (local_170._M_dataplus._M_p + -((long)uVar17 >> 0x3f),__len,uVar18);
    std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
    req = local_118;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_150);
    uVar17 = local_120->keep_alive_max_count_;
    cVar15 = '\x01';
    if (9 < uVar17) {
      uVar18 = uVar17;
      cVar7 = '\x04';
      do {
        cVar15 = cVar7;
        if (uVar18 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0016e189;
        }
        if (uVar18 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0016e189;
        }
        if (uVar18 < 10000) goto LAB_0016e189;
        bVar19 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        cVar7 = cVar15 + '\x04';
      } while (bVar19);
      cVar15 = cVar15 + '\x01';
    }
LAB_0016e189:
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_170,cVar15);
    detail::std::__detail::__to_chars_10_impl<unsigned_long>
              (local_170._M_dataplus._M_p,(uint)local_170._M_string_length,uVar17);
    std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Keep-Alive","");
    Response::set_header(res,&local_170,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) goto LAB_0016db2a;
  }
  bVar8 = res->content_length_ == 0;
  bVar3 = (res->body)._M_string_length == 0;
  bVar19 = (res->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0;
  if ((bVar8 && bVar3) && bVar19) {
    bVar20 = false;
  }
  else {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Content-Type","");
    cVar11 = detail::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::find(&(res->headers)._M_h,&local_170);
    bVar20 = cVar11.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._M_cur == (__node_type *)0x0;
  }
  if (((!bVar8 || !bVar3) || !bVar19) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2)) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (bVar20) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Content-Type","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"text/plain","");
    Response::set_header(res,&local_150,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  bVar8 = res->content_length_ != 0;
  bVar3 = (res->body)._M_string_length != 0;
  bVar19 = (res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0;
  if ((bVar8 || bVar3) || bVar19) {
    bVar20 = false;
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Content-Length","");
    cVar11 = detail::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::find(&(res->headers)._M_h,&local_f0);
    bVar20 = cVar11.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._M_cur == (__node_type *)0x0;
  }
  if (((!bVar8 && !bVar3) && !bVar19) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (bVar20) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Content-Length","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"0","");
    Response::set_header(res,&local_150,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  iVar10 = std::__cxx11::string::compare((char *)req);
  if (iVar10 == 0) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Accept-Ranges","");
    cVar11 = detail::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::find(&(res->headers)._M_h,&local_110);
    bVar19 = cVar11.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._M_cur == (__node_type *)0x0;
  }
  else {
    bVar19 = false;
  }
  if ((iVar10 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2)) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (bVar19) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Accept-Ranges","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bytes","");
    Response::set_header(res,&local_150,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_120->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(local_120->post_routing_handler_)._M_invoker)
              ((_Any_data *)&local_120->post_routing_handler_,req,res);
  }
  pcVar16 = local_150.field_2._M_local_buf + 8;
  local_150._M_dataplus._M_p = (pointer)&PTR__BufferStream_002dedc0;
  local_150.field_2._M_allocated_capacity = 0;
  local_150.field_2._M_local_buf[8] = '\0';
  local_128 = 0;
  local_150._M_string_length = (size_type)pcVar16;
  sVar12 = detail::write_response_line((Stream *)&local_150,res->status);
  if (sVar12 != 0) {
    if ((local_120->header_writer_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    lVar13 = (*(local_120->header_writer_)._M_invoker)
                       ((_Any_data *)&local_120->header_writer_,(Stream *)&local_150,&res->headers);
    uVar5 = local_150.field_2._M_allocated_capacity;
    sVar4 = local_150._M_string_length;
    if (lVar13 != 0) {
      uVar17 = 0;
      do {
        if ((ulong)uVar5 <= uVar17) break;
        iVar10 = (*strm->_vptr_Stream[6])(strm,(char *)(sVar4 + uVar17));
        lVar13 = 0;
        if (-1 < extraout_var) {
          lVar13 = CONCAT44(extraout_var,iVar10);
        }
        uVar17 = uVar17 + lVar13;
      } while (-1 < extraout_var);
      if ((char *)local_150._M_string_length != pcVar16) {
        operator_delete((void *)local_150._M_string_length,
                        CONCAT71(local_150.field_2._9_7_,local_150.field_2._M_local_buf[8]) + 1);
      }
      req_00 = local_118;
      iVar10 = std::__cxx11::string::compare((char *)local_118);
      bVar19 = true;
      if (iVar10 != 0) {
        uVar17 = (res->body)._M_string_length;
        if (uVar17 == 0) {
          if ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0) {
            bVar8 = write_content_with_provider(local_120,strm,req_00,res,&local_b0,&local_d0);
            if (bVar8) {
              res->content_provider_success_ = true;
            }
            else {
              bVar19 = false;
            }
          }
        }
        else {
          pcVar2 = (res->body)._M_dataplus._M_p;
          uVar18 = 0;
          do {
            bVar19 = uVar17 <= uVar18;
            if (uVar17 <= uVar18) break;
            iVar10 = (*strm->_vptr_Stream[6])(strm,pcVar2 + uVar18);
            lVar13 = 0;
            if (-1 < extraout_var_00) {
              lVar13 = CONCAT44(extraout_var_00,iVar10);
            }
            uVar18 = uVar18 + lVar13;
          } while (-1 < extraout_var_00);
        }
      }
      if ((local_120->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(local_120->logger_)._M_invoker)((_Any_data *)&local_120->logger_,local_118,res);
      }
      goto LAB_0016e26d;
    }
  }
  if ((char *)local_150._M_string_length != pcVar16) {
    operator_delete((void *)local_150._M_string_length,
                    CONCAT71(local_150.field_2._9_7_,local_150.field_2._M_local_buf[8]) + 1);
  }
  bVar19 = false;
LAB_0016e26d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return bVar19;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::string s = "timeout=";
    s += std::to_string(keep_alive_timeout_sec_);
    s += ", max=";
    s += std::to_string(keep_alive_max_count_);
    res.set_header("Keep-Alive", s);
  }

  if ((!res.body.empty() || res.content_length_ > 0 || res.content_provider_) &&
      !res.has_header("Content-Type")) {
    res.set_header("Content-Type", "text/plain");
  }

  if (res.body.empty() && !res.content_length_ && !res.content_provider_ &&
      !res.has_header("Content-Length")) {
    res.set_header("Content-Length", "0");
  }

  if (req.method == "HEAD" && !res.has_header("Accept-Ranges")) {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;
    if (!detail::write_response_line(bstrm, res.status)) { return false; }
    if (!header_writer_(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}